

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.hpp
# Opt level: O0

void __thiscall duckdb::TextTreeRendererConfig::TextTreeRendererConfig(TextTreeRendererConfig *this)

{
  TextTreeRendererConfig *this_local;
  
  this->maximum_render_width = 0xf0;
  this->node_render_width = 0x1d;
  this->minimum_render_width = 0xf;
  this->max_extra_lines = 0x1e;
  this->detailed = false;
  this->LTCORNER = anon_var_dwarf_13e21;
  this->RTCORNER = anon_var_dwarf_13e35;
  this->LDCORNER = anon_var_dwarf_13e9d;
  this->RDCORNER = anon_var_dwarf_13eb1;
  this->MIDDLE = anon_var_dwarf_13e7f;
  this->TMIDDLE = anon_var_dwarf_13e2b;
  this->LMIDDLE = anon_var_dwarf_13e75;
  this->RMIDDLE = anon_var_dwarf_13e89;
  this->DMIDDLE = anon_var_dwarf_13ea7;
  this->VERTICAL = anon_var_dwarf_9fc3b6 + 3;
  this->HORIZONTAL = anon_var_dwarf_13e93;
  return;
}

Assistant:

void EnableDetailed() {
		max_extra_lines = 1000;
		detailed = true;
	}